

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::print_update(search_private *priv)

{
  bool bVar1;
  vw *pvVar2;
  undefined1 auVar3 [16];
  shared_data *psVar4;
  size_t i;
  ulong uVar5;
  char cVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char total_pred [8];
  char pred_label [21];
  char true_label [21];
  float local_a8;
  float fStack_a4;
  char total_exge [8];
  char total_cach [8];
  char inst_cntr [9];
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  pvVar2 = priv->all;
  if ((priv->printed_output_header == false) && (pvVar2->quiet == false)) {
    print_update();
  }
  psVar4 = pvVar2->sd;
  if (psVar4->weighted_labeled_examples + psVar4->weighted_unlabeled_examples <
      (double)psVar4->dump_interval) {
    return;
  }
  if (pvVar2->quiet != false) {
    return;
  }
  if (pvVar2->bfgs != false) {
    return;
  }
  std::__cxx11::stringbuf::str();
  uVar5 = 0;
  do {
    cVar6 = ' ';
    if (uVar5 < local_48) {
      cVar6 = ' ';
      if (1 < (byte)(local_50[uVar5] - 9)) {
        cVar6 = local_50[uVar5];
      }
    }
    true_label[uVar5] = cVar6;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  if (0x14 < local_48) {
    true_label[0x12] = '.';
    true_label[0x13] = '.';
  }
  true_label[0x14] = '\0';
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__cxx11::stringbuf::str();
  uVar5 = 0;
  do {
    cVar6 = ' ';
    if (uVar5 < local_68) {
      cVar6 = ' ';
      if (1 < (byte)(local_70[uVar5] - 9)) {
        cVar6 = local_70[uVar5];
      }
    }
    pred_label[uVar5] = cVar6;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  if (0x14 < local_68) {
    pred_label[0x12] = '.';
    pred_label[0x13] = '.';
  }
  pred_label[0x14] = '\0';
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (pvVar2->holdout_set_off == true) {
    psVar4 = pvVar2->sd;
  }
  else {
    psVar4 = pvVar2->sd;
    if ((pvVar2->current_pass != 0) && (0.0 < psVar4->weighted_holdout_examples)) {
      auVar9._4_4_ = (float)psVar4->holdout_sum_loss_since_last_dump;
      auVar9._0_4_ = (float)psVar4->holdout_sum_loss;
      auVar9._8_8_ = 0;
      fVar7 = (float)psVar4->weighted_holdout_examples;
      auVar11._4_4_ = (float)psVar4->weighted_holdout_examples_since_last_dump;
      auVar11._0_4_ = fVar7;
      auVar11._8_8_ = 0;
      auVar11 = divps(auVar9,auVar11);
      local_a8 = (float)(-(uint)(fVar7 != 0.0) & auVar11._0_4_);
      fStack_a4 = (float)(-(uint)((float)psVar4->weighted_holdout_examples_since_last_dump != 0.0) &
                         auVar11._4_4_);
      psVar4->weighted_holdout_examples_since_last_dump = 0.0;
      pvVar2->sd->holdout_sum_loss_since_last_dump = 0.0;
      psVar4 = pvVar2->sd;
      bVar1 = true;
      goto LAB_00269bfa;
    }
  }
  auVar10._0_4_ = (float)psVar4->sum_loss;
  auVar10._4_4_ = (float)psVar4->sum_loss_since_last_dump;
  auVar10._8_8_ = 0;
  fVar7 = (float)psVar4->weighted_labeled_examples;
  fVar8 = (float)(psVar4->weighted_labeled_examples - psVar4->old_weighted_labeled_examples);
  auVar3._4_4_ = fVar8;
  auVar3._0_4_ = fVar7;
  auVar3._8_8_ = 0;
  auVar11 = divps(auVar10,auVar3);
  local_a8 = (float)(-(uint)(fVar7 != 0.0) & auVar11._0_4_);
  fStack_a4 = (float)(-(uint)(fVar8 != 0.0) & auVar11._4_4_);
  bVar1 = false;
LAB_00269bfa:
  number_to_natural(psVar4->example_number,inst_cntr);
  number_to_natural(priv->total_predictions_made,total_pred);
  number_to_natural(priv->total_cache_hits,total_cach);
  number_to_natural(priv->total_examples_generated,total_exge);
  fVar7 = (float)priv->num_calls_to_run;
  if (priv->active_csoaa == false) {
    fVar7 = priv->beta;
  }
  fprintf(_stderr,"%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f",
          SUB84((double)local_a8,0),(double)fStack_a4,SUB84((double)fVar7,0),inst_cntr,true_label,
          pred_label,(ulong)(uint)priv->read_example_last_pass,(ulong)priv->current_policy,
          total_pred,total_cach,total_exge);
  if (bVar1) {
    print_update();
  }
  fputc(10,_stderr);
  fflush(_stderr);
  psVar4 = pvVar2->sd;
  bVar1 = pvVar2->progress_add;
  fVar7 = pvVar2->progress_arg;
  psVar4->sum_loss_since_last_dump = 0.0;
  psVar4->old_weighted_labeled_examples = psVar4->weighted_labeled_examples;
  fVar8 = (float)(psVar4->weighted_labeled_examples + psVar4->weighted_unlabeled_examples);
  if (bVar1 == false) {
    fVar7 = fVar7 * fVar8;
  }
  else {
    fVar7 = fVar7 + fVar8;
  }
  psVar4->dump_interval = fVar7;
  return;
}

Assistant:

void print_update(search_private& priv)
{
  vw& all = *priv.all;
  if (!priv.printed_output_header && !all.quiet)
  {
    const char* header_fmt = "%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n";
    fprintf(stderr, header_fmt, "average", "since", "instance", "current true", "current predicted", "cur", "cur",
        "predic", "cache", "examples", "");
    if (priv.active_csoaa)
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "#run");
    else
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "beta");
    std::cerr.precision(5);
    priv.printed_output_header = true;
  }

  if (!should_print_update(all, priv.hit_new_pass))
    return;

  char true_label[21];
  char pred_label[21];
  to_short_string(priv.truth_string->str(), 20, true_label);
  to_short_string(priv.pred_string->str(), 20, pred_label);

  float avg_loss = 0.;
  float avg_loss_since = 0.;
  bool use_heldout_loss = (!all.holdout_set_off && all.current_pass >= 1) && (all.sd->weighted_holdout_examples > 0);
  if (use_heldout_loss)
  {
    avg_loss = safediv((float)all.sd->holdout_sum_loss, (float)all.sd->weighted_holdout_examples);
    avg_loss_since = safediv(
        (float)all.sd->holdout_sum_loss_since_last_dump, (float)all.sd->weighted_holdout_examples_since_last_dump);

    all.sd->weighted_holdout_examples_since_last_dump = 0;
    all.sd->holdout_sum_loss_since_last_dump = 0.0;
  }
  else
  {
    avg_loss = safediv((float)all.sd->sum_loss, (float)all.sd->weighted_labeled_examples);
    avg_loss_since = safediv((float)all.sd->sum_loss_since_last_dump,
        (float)(all.sd->weighted_labeled_examples - all.sd->old_weighted_labeled_examples));
  }

  char inst_cntr[9];
  number_to_natural((size_t)all.sd->example_number, inst_cntr);
  char total_pred[8];
  number_to_natural(priv.total_predictions_made, total_pred);
  char total_cach[8];
  number_to_natural(priv.total_cache_hits, total_cach);
  char total_exge[8];
  number_to_natural(priv.total_examples_generated, total_exge);

  fprintf(stderr, "%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f", avg_loss, avg_loss_since, inst_cntr,
      true_label, pred_label, (int)priv.read_example_last_pass, (int)priv.current_policy, total_pred, total_cach,
      total_exge, priv.active_csoaa ? priv.num_calls_to_run : priv.beta);

  if (PRINT_CLOCK_TIME)
  {
    size_t num_sec = (size_t)(((float)(clock() - priv.start_clock_time)) / CLOCKS_PER_SEC);
    cerr << " " << num_sec << "sec";
  }

  if (use_heldout_loss)
    fprintf(stderr, " h");

  fprintf(stderr, "\n");
  fflush(stderr);
  all.sd->update_dump_interval(all.progress_add, all.progress_arg);
}